

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::SerializePartialToZeroCopyStream
          (MessageLite *this,ZeroCopyOutputStream *output)

{
  byte bVar1;
  int iVar2;
  undefined4 extraout_var;
  LogMessage *pLVar3;
  undefined4 extraout_var_00;
  undefined1 local_88 [8];
  EpsCopyOutputStream stream;
  undefined1 local_38 [23];
  LogFinisher local_21;
  
  iVar2 = (*this->_vptr_MessageLite[9])();
  if ((CONCAT44(extraout_var,iVar2) & 0xffffffff80000000) == 0) {
    stream.stream_._2_1_ = io::CodedOutputStream::default_serialization_deterministic_ & 1;
    local_88 = (undefined1  [8])&stream.buffer_end_;
    stream.stream_._0_2_ = 0;
    stream.end_ = (uint8 *)local_88;
    stream.buffer_._24_8_ = output;
    iVar2 = (*this->_vptr_MessageLite[0xc])(this,local_88,(EpsCopyOutputStream *)local_88);
    io::EpsCopyOutputStream::Trim
              ((EpsCopyOutputStream *)local_88,(uint8 *)CONCAT44(extraout_var_00,iVar2));
    bVar1 = (byte)stream.stream_ ^ 1;
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_88,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/message_lite.cc"
               ,0x19a);
    (*this->_vptr_MessageLite[2])(&stream.had_error_,this);
    pLVar3 = internal::LogMessage::operator<<((LogMessage *)local_88,(string *)&stream.had_error_);
    pLVar3 = internal::LogMessage::operator<<(pLVar3," exceeded maximum protobuf size of 2GB: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,CONCAT44(extraout_var,iVar2));
    internal::LogFinisher::operator=(&local_21,pLVar3);
    if ((undefined1 *)stream._56_8_ != local_38) {
      operator_delete((void *)stream._56_8_);
    }
    internal::LogMessage::~LogMessage((LogMessage *)local_88);
    bVar1 = 0;
  }
  return (bool)bVar1;
}

Assistant:

bool MessageLite::SerializePartialToZeroCopyStream(
    io::ZeroCopyOutputStream* output) const {
  const size_t size = ByteSizeLong();  // Force size to be cached.
  if (size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }

  uint8* target;
  io::EpsCopyOutputStream stream(
      output, io::CodedOutputStream::IsDefaultSerializationDeterministic(),
      &target);
  target = _InternalSerialize(target, &stream);
  stream.Trim(target);
  if (stream.HadError()) return false;
  return true;
}